

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O1

void __thiscall QAbstractButton::setText(QAbstractButton *this,QString *text)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  QKeySequence newMnemonic;
  undefined1 *local_50;
  code *local_48;
  undefined8 uStack_40;
  QAbstractButton *local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  lVar2 = (text->d).size;
  if (*(long *)(lVar1 + 0x268) == lVar2) {
    QVar4.m_data = *(storage_type_conflict **)(lVar1 + 0x260);
    QVar4.m_size = *(long *)(lVar1 + 0x268);
    QVar5.m_data = (text->d).ptr;
    QVar5.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar4,QVar5);
    if (cVar3 != '\0') goto LAB_003c517a;
  }
  QString::operator=((QString *)(lVar1 + 600),(QString *)text);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QKeySequence::mnemonic((QString *)&local_50);
  setShortcut(this,(QKeySequence *)&local_50);
  *(undefined8 *)(lVar1 + 0x2ac) = 0xffffffffffffffff;
  QWidget::update(&this->super_QWidget);
  QWidget::updateGeometry(&this->super_QWidget);
  local_48 = QFont::strikeOut;
  uStack_40 = 0xaaaaaaaa0000800c;
  uStack_30 = 0xaaaaaaaaffffffff;
  local_38 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
  QKeySequence::~QKeySequence((QKeySequence *)&local_50);
LAB_003c517a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::setText(const QString &text)
{
    Q_D(QAbstractButton);
    if (d->text == text)
        return;
    d->text = text;
#ifndef QT_NO_SHORTCUT
    QKeySequence newMnemonic = QKeySequence::mnemonic(text);
    setShortcut(newMnemonic);
#endif
    d->sizeHint = QSize();
    update();
    updateGeometry();
#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::NameChanged);
    QAccessible::updateAccessibility(&event);
#endif
}